

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrDestroySession(XrSession session)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroySession)(session);
  CoreValidationDeleteSessionLabels(session);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_session_info.super_HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>,
               session);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroySession(
    XrSession session) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroySession(session);

        // Clean up any labels associated with this session
        CoreValidationDeleteSessionLabels(session);

        if (XR_SUCCEEDED(result)) {
            g_session_info.erase(session);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}